

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree.hpp
# Opt level: O0

void __thiscall
Indexing::SubstitutionTree<Indexing::LiteralClause>::SListIntermediateNode::SListIntermediateNode
          (SListIntermediateNode *this,TermList ts,uint childVar)

{
  TermList in_RSI;
  undefined8 *in_RDI;
  undefined4 in_stack_ffffffffffffffd0;
  uint in_stack_ffffffffffffffd4;
  IntermediateNode *in_stack_ffffffffffffffd8;
  
  SubstitutionTree<Indexing::LiteralClause>::IntermediateNode::IntermediateNode
            (in_stack_ffffffffffffffd8,in_RSI,in_stack_ffffffffffffffd4);
  *in_RDI = &PTR__SListIntermediateNode_0130a088;
  Lib::
  SkipList<Indexing::SubstitutionTree<Indexing::LiteralClause>::Node_*,_Indexing::SubstitutionTree<Indexing::LiteralClause>::SListIntermediateNode::NodePtrComparator>
  ::SkipList((SkipList<Indexing::SubstitutionTree<Indexing::LiteralClause>::Node_*,_Indexing::SubstitutionTree<Indexing::LiteralClause>::SListIntermediateNode::NodePtrComparator>
              *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  return;
}

Assistant:

SListIntermediateNode(TermList ts, unsigned childVar) : IntermediateNode(ts, childVar) {}